

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

void __thiscall QGraphicsSceneIndex::clear(QGraphicsSceneIndex *this)

{
  int i;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d._0_4_ = 0xaaaaaaaa;
  local_38.d._4_4_ = 0xaaaaaaaa;
  local_38.ptr._0_4_ = 0xaaaaaaaa;
  local_38.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0x60))(&local_38,this,1);
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_38.size; puVar1 = puVar1 + 1) {
    (**(code **)(*(long *)this + 0xb8))
              (this,*(undefined8 *)
                     (CONCAT44(local_38.ptr._4_4_,local_38.ptr._0_4_) + (long)puVar1 * 8));
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneIndex::clear()
{
    const QList<QGraphicsItem *> allItems = items();
    for (int i = 0 ; i < allItems.size(); ++i)
        removeItem(allItems.at(i));
}